

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Int FT_Get_Charmap_Index(FT_CharMap charmap)

{
  FT_Face pFVar1;
  FT_Int FVar2;
  ulong uVar3;
  ulong uVar4;
  
  FVar2 = -1;
  if ((charmap != (FT_CharMap)0x0) && (pFVar1 = charmap->face, pFVar1 != (FT_Face)0x0)) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)pFVar1->num_charmaps;
    if (pFVar1->num_charmaps < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (pFVar1->charmaps[uVar4] == charmap) {
        uVar3 = uVar4 & 0xffffffff;
        break;
      }
    }
    FVar2 = (FT_Int)uVar3;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Get_Charmap_Index( FT_CharMap  charmap )
  {
    FT_Int  i;


    if ( !charmap || !charmap->face )
      return -1;

    for ( i = 0; i < charmap->face->num_charmaps; i++ )
      if ( charmap->face->charmaps[i] == charmap )
        break;

    FT_ASSERT( i < charmap->face->num_charmaps );

    return i;
  }